

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_serial_dump.cpp
# Opt level: O3

void set_port_option<boost::asio::serial_port_base::character_size>
               (serial_port *port,character_size *option,string *device_name,string *name)

{
  runtime_error *this;
  long *plVar1;
  size_type *psVar2;
  error_code ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  error_code local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  boost::system::error_code::error_code(&local_e0);
  boost::asio::detail::reactive_serial_port_service::do_set_option
            ((port->port).impl_.service_,&(port->port).impl_.implementation_,
             boost::asio::detail::reactive_serial_port_service::
             store_option<boost::asio::serial_port_base::character_size>,option,&local_e0);
  if (local_e0.failed_ != true) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_b0,"error setting \"",name);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_d0._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar2) {
    local_d0.field_2._M_allocated_capacity = *psVar2;
    local_d0.field_2._8_8_ = plVar1[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar2;
  }
  local_d0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::operator+(&local_70,&local_d0,device_name);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_100._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_100._M_dataplus._M_p == psVar2) {
    local_100.field_2._M_allocated_capacity = *psVar2;
    local_100.field_2._8_4_ = (undefined4)plVar1[3];
    local_100.field_2._12_4_ = *(undefined4 *)((long)plVar1 + 0x1c);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar2;
  }
  local_100._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  (*(local_e0.cat_)->_vptr_error_category[4])(&local_90,local_e0.cat_,(ulong)(uint)local_e0.val_);
  std::operator+(&local_50,&local_100,&local_90);
  std::runtime_error::runtime_error(this,(string *)&local_50);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void set_port_option( serial_port& port, const O& option,
    const std::string& device_name, const std::string& name )
{
    boost::system::error_code ec;
    port.port.set_option( option, ec );

    if ( ec )
        throw std::runtime_error( "error setting \"" + name + "\" on \"" + device_name + "\": " + ec.message() );
}